

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

char * ma_result_description(ma_result result)

{
  ma_result result_local;
  char *local_8;
  
  switch(result) {
  case MA_SUCCESS:
    local_8 = "No error";
    break;
  case MA_FAILED_TO_STOP_BACKEND_DEVICE:
    local_8 = "Failed to stop backend device";
    break;
  case MA_FAILED_TO_START_BACKEND_DEVICE:
    local_8 = "Failed to start backend device";
    break;
  case MA_FAILED_TO_OPEN_BACKEND_DEVICE:
    local_8 = "Failed to open backend device";
    break;
  case MA_FAILED_TO_INIT_BACKEND:
    local_8 = "Failed to initialize backend";
    break;
  default:
    local_8 = "Unknown error";
    break;
  case MA_DEVICE_NOT_STARTED:
    local_8 = "Device not started";
    break;
  case MA_DEVICE_NOT_INITIALIZED:
    local_8 = "Device not initialized";
    break;
  case MA_INVALID_DEVICE_CONFIG:
    local_8 = "Invalid device config";
    break;
  case MA_API_NOT_FOUND:
    local_8 = "API not found";
    break;
  case MA_NO_DEVICE:
    local_8 = "No device";
    break;
  case MA_NO_BACKEND:
    local_8 = "No backend";
    break;
  case MA_SHARE_MODE_NOT_SUPPORTED:
    local_8 = "Share mode not supported";
    break;
  case MA_DEVICE_TYPE_NOT_SUPPORTED:
    local_8 = "Device type not supported";
    break;
  case MA_FORMAT_NOT_SUPPORTED:
    local_8 = "Format not supported";
    break;
  case MA_MEMORY_ALREADY_MAPPED:
    local_8 = "Memory already mapped";
    break;
  case MA_CANCELLED:
    local_8 = "Operation cancelled";
    break;
  case MA_IN_PROGRESS:
    local_8 = "Operation in progress";
    break;
  case MA_NO_HOST:
    local_8 = "No host";
    break;
  case MA_CONNECTION_REFUSED:
    local_8 = "Connection refused";
    break;
  case MA_NOT_CONNECTED:
    local_8 = "Not connected";
    break;
  case MA_ALREADY_CONNECTED:
    local_8 = "Already connected";
    break;
  case MA_CONNECTION_RESET:
    local_8 = "Connection reset";
    break;
  case MA_SOCKET_NOT_SUPPORTED:
    local_8 = "Socket type not supported";
    break;
  case MA_ADDRESS_FAMILY_NOT_SUPPORTED:
    local_8 = "Address family not supported";
    break;
  case MA_PROTOCOL_FAMILY_NOT_SUPPORTED:
    local_8 = "Protocol family not supported";
    break;
  case MA_PROTOCOL_NOT_SUPPORTED:
    local_8 = "Protocol not supported";
    break;
  case MA_PROTOCOL_UNAVAILABLE:
    local_8 = "Protocol not available";
    break;
  case MA_BAD_PROTOCOL:
    local_8 = "Protocol wrong type for socket";
    break;
  case MA_NO_ADDRESS:
    local_8 = "Destination address required";
    break;
  case MA_NOT_SOCKET:
    local_8 = "Socket operation on non-socket";
    break;
  case MA_NOT_UNIQUE:
    local_8 = "Not unique";
    break;
  case MA_NO_NETWORK:
    local_8 = "Network unavailable";
    break;
  case MA_TIMEOUT:
    local_8 = "Timeout";
    break;
  case MA_INVALID_DATA:
    local_8 = "Invalid data";
    break;
  case MA_NO_DATA_AVAILABLE:
    local_8 = "No data available";
    break;
  case MA_BAD_MESSAGE:
    local_8 = "Invalid message";
    break;
  case MA_NO_MESSAGE:
    local_8 = "No message of desired type";
    break;
  case MA_NOT_IMPLEMENTED:
    local_8 = "Not implemented";
    break;
  case MA_TOO_MANY_LINKS:
    local_8 = "Too many links";
    break;
  case MA_DEADLOCK:
    local_8 = "Deadlock";
    break;
  case MA_BAD_PIPE:
    local_8 = "Broken pipe";
    break;
  case MA_BAD_SEEK:
    local_8 = "Illegal seek";
    break;
  case MA_BAD_ADDRESS:
    local_8 = "Bad address";
    break;
  case MA_ALREADY_IN_USE:
    local_8 = "Resource already in use";
    break;
  case MA_UNAVAILABLE:
    local_8 = "Resource unavailable";
    break;
  case MA_INTERRUPT:
    local_8 = "Interrupted";
    break;
  case MA_IO_ERROR:
    local_8 = "Input/output error";
    break;
  case MA_BUSY:
    local_8 = "Device or resource busy";
    break;
  case MA_NO_SPACE:
    local_8 = "No space available";
    break;
  case MA_AT_END:
    local_8 = "At end";
    break;
  case MA_DIRECTORY_NOT_EMPTY:
    local_8 = "Directory not empty";
    break;
  case MA_IS_DIRECTORY:
    local_8 = "Is a directory";
    break;
  case MA_NOT_DIRECTORY:
    local_8 = "Not a directory";
    break;
  case MA_NAME_TOO_LONG:
    local_8 = "Name too long";
    break;
  case MA_PATH_TOO_LONG:
    local_8 = "Path too long";
    break;
  case MA_TOO_BIG:
    local_8 = "Too large";
    break;
  case MA_INVALID_FILE:
    local_8 = "Invalid file";
    break;
  case MA_TOO_MANY_OPEN_FILES:
    local_8 = "Too many open files";
    break;
  case MA_ALREADY_EXISTS:
    local_8 = "Resource already exists";
    break;
  case MA_DOES_NOT_EXIST:
    local_8 = "Resource does not exist";
    break;
  case MA_ACCESS_DENIED:
    local_8 = "Permission denied";
    break;
  case MA_OUT_OF_RANGE:
    local_8 = "Out of range";
    break;
  case MA_OUT_OF_MEMORY:
    local_8 = "Out of memory";
    break;
  case MA_INVALID_OPERATION:
    local_8 = "Invalid operation";
    break;
  case MA_INVALID_ARGS:
    local_8 = "Invalid argument";
    break;
  case MA_ERROR:
    local_8 = "Unknown error";
  }
  return local_8;
}

Assistant:

MA_API const char* ma_result_description(ma_result result)
{
    switch (result)
    {
        case MA_SUCCESS:                       return "No error";
        case MA_ERROR:                         return "Unknown error";
        case MA_INVALID_ARGS:                  return "Invalid argument";
        case MA_INVALID_OPERATION:             return "Invalid operation";
        case MA_OUT_OF_MEMORY:                 return "Out of memory";
        case MA_OUT_OF_RANGE:                  return "Out of range";
        case MA_ACCESS_DENIED:                 return "Permission denied";
        case MA_DOES_NOT_EXIST:                return "Resource does not exist";
        case MA_ALREADY_EXISTS:                return "Resource already exists";
        case MA_TOO_MANY_OPEN_FILES:           return "Too many open files";
        case MA_INVALID_FILE:                  return "Invalid file";
        case MA_TOO_BIG:                       return "Too large";
        case MA_PATH_TOO_LONG:                 return "Path too long";
        case MA_NAME_TOO_LONG:                 return "Name too long";
        case MA_NOT_DIRECTORY:                 return "Not a directory";
        case MA_IS_DIRECTORY:                  return "Is a directory";
        case MA_DIRECTORY_NOT_EMPTY:           return "Directory not empty";
        case MA_AT_END:                        return "At end";
        case MA_NO_SPACE:                      return "No space available";
        case MA_BUSY:                          return "Device or resource busy";
        case MA_IO_ERROR:                      return "Input/output error";
        case MA_INTERRUPT:                     return "Interrupted";
        case MA_UNAVAILABLE:                   return "Resource unavailable";
        case MA_ALREADY_IN_USE:                return "Resource already in use";
        case MA_BAD_ADDRESS:                   return "Bad address";
        case MA_BAD_SEEK:                      return "Illegal seek";
        case MA_BAD_PIPE:                      return "Broken pipe";
        case MA_DEADLOCK:                      return "Deadlock";
        case MA_TOO_MANY_LINKS:                return "Too many links";
        case MA_NOT_IMPLEMENTED:               return "Not implemented";
        case MA_NO_MESSAGE:                    return "No message of desired type";
        case MA_BAD_MESSAGE:                   return "Invalid message";
        case MA_NO_DATA_AVAILABLE:             return "No data available";
        case MA_INVALID_DATA:                  return "Invalid data";
        case MA_TIMEOUT:                       return "Timeout";
        case MA_NO_NETWORK:                    return "Network unavailable";
        case MA_NOT_UNIQUE:                    return "Not unique";
        case MA_NOT_SOCKET:                    return "Socket operation on non-socket";
        case MA_NO_ADDRESS:                    return "Destination address required";
        case MA_BAD_PROTOCOL:                  return "Protocol wrong type for socket";
        case MA_PROTOCOL_UNAVAILABLE:          return "Protocol not available";
        case MA_PROTOCOL_NOT_SUPPORTED:        return "Protocol not supported";
        case MA_PROTOCOL_FAMILY_NOT_SUPPORTED: return "Protocol family not supported";
        case MA_ADDRESS_FAMILY_NOT_SUPPORTED:  return "Address family not supported";
        case MA_SOCKET_NOT_SUPPORTED:          return "Socket type not supported";
        case MA_CONNECTION_RESET:              return "Connection reset";
        case MA_ALREADY_CONNECTED:             return "Already connected";
        case MA_NOT_CONNECTED:                 return "Not connected";
        case MA_CONNECTION_REFUSED:            return "Connection refused";
        case MA_NO_HOST:                       return "No host";
        case MA_IN_PROGRESS:                   return "Operation in progress";
        case MA_CANCELLED:                     return "Operation cancelled";
        case MA_MEMORY_ALREADY_MAPPED:         return "Memory already mapped";

        case MA_FORMAT_NOT_SUPPORTED:          return "Format not supported";
        case MA_DEVICE_TYPE_NOT_SUPPORTED:     return "Device type not supported";
        case MA_SHARE_MODE_NOT_SUPPORTED:      return "Share mode not supported";
        case MA_NO_BACKEND:                    return "No backend";
        case MA_NO_DEVICE:                     return "No device";
        case MA_API_NOT_FOUND:                 return "API not found";
        case MA_INVALID_DEVICE_CONFIG:         return "Invalid device config";

        case MA_DEVICE_NOT_INITIALIZED:        return "Device not initialized";
        case MA_DEVICE_NOT_STARTED:            return "Device not started";

        case MA_FAILED_TO_INIT_BACKEND:        return "Failed to initialize backend";
        case MA_FAILED_TO_OPEN_BACKEND_DEVICE: return "Failed to open backend device";
        case MA_FAILED_TO_START_BACKEND_DEVICE: return "Failed to start backend device";
        case MA_FAILED_TO_STOP_BACKEND_DEVICE: return "Failed to stop backend device";

        default:                               return "Unknown error";
    }
}